

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_add_checked(roaring_bitmap_t *r,uint32_t val)

{
  uint8_t typecode;
  ushort uVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  char cVar5;
  int iVar6;
  undefined8 in_RAX;
  shared_container_t *sc;
  undefined8 *c;
  container_t *c_00;
  run_container_t *prVar7;
  void **ppvVar8;
  long lVar9;
  long lVar10;
  ushort key;
  int iVar11;
  uint uVar12;
  uint uVar13;
  run_container_t *run;
  uint8_t newtypecode;
  undefined8 uStack_38;
  
  iVar11 = (r->high_low_container).size;
  key = (ushort)(val >> 0x10);
  uStack_38 = in_RAX;
  if (((long)iVar11 == 0) ||
     (puVar2 = (r->high_low_container).keys, puVar2[(long)iVar11 + -1] == key)) {
    uVar12 = iVar11 - 1;
  }
  else {
    if (iVar11 < 1) {
      uVar12 = 0xffffffff;
      goto LAB_0011a4bd;
    }
    iVar11 = iVar11 + -1;
    uVar13 = 0;
    do {
      uVar12 = iVar11 + uVar13 >> 1;
      uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar11 + uVar13 & 0xfffffffe));
      if (uVar1 < key) {
        uVar13 = uVar12 + 1;
      }
      else {
        if (uVar1 <= key) goto LAB_0011a3c6;
        iVar11 = uVar12 - 1;
      }
    } while ((int)uVar13 <= iVar11);
    uVar12 = ~uVar13;
  }
  if (-1 < (int)uVar12) {
LAB_0011a3c6:
    ppvVar8 = (r->high_low_container).containers;
    puVar3 = (r->high_low_container).typecodes;
    uVar13 = uVar12 & 0xffff;
    sc = (shared_container_t *)ppvVar8[uVar13];
    if (puVar3[uVar13] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar13);
      ppvVar8 = (r->high_low_container).containers;
    }
    *(shared_container_t **)((long)ppvVar8 + (ulong)(uVar13 * 8)) = sc;
    typecode = (r->high_low_container).typecodes[uVar13];
    run = *(run_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar13 * 8));
    prVar7 = run;
    uVar4 = typecode;
    if (typecode == '\x04') {
      uVar4 = *(uint8_t *)&run->runs;
      prVar7 = *(run_container_t **)run;
    }
    if (uVar4 == '\x03') {
      uVar13 = croaring_hardware_support();
      if ((uVar13 & 2) == 0) {
        uVar13 = croaring_hardware_support();
        if ((uVar13 & 1) == 0) {
          iVar11 = prVar7->n_runs;
          lVar9 = (long)iVar11;
          if (0 < lVar9) {
            lVar10 = 0;
            do {
              iVar11 = iVar11 + (uint)prVar7->runs[lVar10].length;
              lVar10 = lVar10 + 1;
            } while (lVar9 != lVar10);
          }
        }
        else {
          iVar11 = _avx2_run_container_cardinality(prVar7);
        }
      }
      else {
        iVar11 = _avx512_run_container_cardinality(prVar7);
      }
    }
    else {
      iVar11 = prVar7->n_runs;
    }
    uStack_38._0_7_ = CONCAT16(typecode,(undefined6)uStack_38);
    prVar7 = (run_container_t *)
             container_add(run,(uint16_t)val,typecode,(uint8_t *)((long)&uStack_38 + 6));
    if (prVar7 != run) {
      container_free(run,typecode);
      (r->high_low_container).containers[uVar12] = prVar7;
      (r->high_low_container).typecodes[uVar12] = uStack_38._6_1_;
      return true;
    }
    cVar5 = uStack_38._6_1_;
    if (uStack_38._6_1_ == '\x04') {
      cVar5 = *(char *)&run->runs;
      run = *(run_container_t **)run;
    }
    if (cVar5 == '\x03') {
      uVar12 = croaring_hardware_support();
      if ((uVar12 & 2) == 0) {
        uVar12 = croaring_hardware_support();
        if ((uVar12 & 1) == 0) {
          iVar6 = run->n_runs;
          lVar9 = (long)iVar6;
          if (0 < lVar9) {
            lVar10 = 0;
            do {
              iVar6 = iVar6 + (uint)run->runs[lVar10].length;
              lVar10 = lVar10 + 1;
            } while (lVar9 != lVar10);
          }
        }
        else {
          iVar6 = _avx2_run_container_cardinality(run);
        }
      }
      else {
        iVar6 = _avx512_run_container_cardinality(run);
      }
    }
    else {
      iVar6 = run->n_runs;
    }
    return iVar11 != iVar6;
  }
LAB_0011a4bd:
  c = (undefined8 *)(*global_memory_hook.malloc)(0x10);
  if (c != (undefined8 *)0x0) {
    *c = 0;
    c[1] = 0;
  }
  c_00 = container_add(c,(uint16_t)val,'\x02',(uint8_t *)((long)&uStack_38 + 7));
  ra_insert_new_key_value_at(&r->high_low_container,~uVar12,key,c_00,uStack_38._7_1_);
  return true;
}

Assistant:

bool roaring_bitmap_add_checked(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    bool result = false;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, (uint16_t)i);
        container_t *container = ra_get_container_at_index(
            &r->high_low_container, (uint16_t)i, &typecode);

        const int oldCardinality =
            container_get_cardinality(container, typecode);

        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_add(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
            result = true;
        } else {
            const int newCardinality =
                container_get_cardinality(container, newtypecode);

            result = oldCardinality != newCardinality;
        }
    } else {
        array_container_t *newac = array_container_create();
        container_t *container =
            container_add(newac, val & 0xFFFF, ARRAY_CONTAINER_TYPE, &typecode);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(&r->high_low_container, -i - 1, hb,
                                   container, typecode);
        result = true;
    }

    return result;
}